

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osh_adapt.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  void **this;
  CmdLineFlag *pCVar1;
  byte bVar2;
  bool bVar3;
  Int IVar4;
  int iVar5;
  string *psVar6;
  ostream *poVar7;
  undefined8 uVar8;
  Read<double> local_d40;
  Read<double> local_d30;
  Read<double> local_d20;
  allocator local_d09;
  string local_d08 [32];
  undefined1 local_ce8 [8];
  Read<double> metric;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb8 [8];
  string metric_out_ext;
  allocator local_c91;
  string local_c90 [39];
  allocator local_c69;
  string local_c68 [32];
  string local_c48 [32];
  path local_c28 [8];
  path metric_out;
  allocator local_c01;
  string local_c00 [32];
  Read<double> local_be0;
  AdaptOpts local_bd0 [8];
  AdaptOpts opts;
  Read<double> local_a80;
  allocator local_a69;
  string local_a68 [32];
  Read<double> local_a48;
  Read<double> local_a38;
  Read<double> local_a28;
  path local_a18 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f8 [8];
  string metric_in_ext;
  undefined1 auStack_9d0 [4];
  Int dim;
  Reals target_metric;
  Mesh local_9b0 [8];
  Mesh mesh;
  allocator local_5d1;
  string local_5d0 [39];
  allocator local_5a9;
  string local_5a8 [32];
  string local_588 [32];
  path local_568 [8];
  path metric_in;
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [32];
  string local_4f8 [32];
  path local_4d8 [8];
  path mesh_out;
  allocator local_4b1;
  string local_4b0 [39];
  allocator local_489;
  string local_488 [32];
  string local_468 [32];
  path local_448 [8];
  path mesh_in;
  allocator local_421;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [39];
  allocator local_3d1;
  string local_3d0 [36];
  undefined4 local_3ac;
  shared_ptr<Omega_h::Comm> local_3a8;
  string local_398 [39];
  allocator local_371;
  string local_370 [39];
  allocator local_349;
  string local_348 [39];
  allocator local_321;
  string local_320 [32];
  string *local_300;
  CmdLineFlag *metric_out_flag;
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [32];
  string *local_260;
  CmdLineFlag *metric_in_flag;
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [32];
  string *local_1c0;
  CmdLineFlag *mesh_out_flag;
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [32];
  string *local_120;
  CmdLineFlag *mesh_in_flag;
  char *metric_doc;
  CmdLine cmdline;
  undefined1 local_c0 [8];
  CommPtr comm;
  Library lib;
  char **argv_local;
  int argc_local;
  Int local_24;
  Int local_20;
  Int local_1c;
  undefined1 *local_18;
  undefined1 *local_10;
  
  argv_local._4_4_ = 0;
  lib.timers._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)argv;
  argv_local._0_4_ = argc;
  Omega_h::Library::Library
            ((Library *)
             &comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (int *)&argv_local,
             (char ***)&lib.timers._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Omega_h::Library::world();
  Omega_h::CmdLine::CmdLine((CmdLine *)&metric_doc);
  mesh_in_flag = (CmdLineFlag *)anon_var_dwarf_6703;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"--mesh-in",&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"input mesh file path",&local_169);
  psVar6 = (string *)Omega_h::CmdLine::add_flag((string *)&metric_doc,local_140);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  local_120 = psVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"mesh.msh",&local_191);
  std::__cxx11::string::string((string *)&mesh_out_flag);
  Omega_h::CmdLineFlag::add_arg<std::__cxx11::string>(psVar6,local_190);
  std::__cxx11::string::~string((string *)&mesh_out_flag);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"--mesh-out",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"output mesh file path",&local_209);
  psVar6 = (string *)Omega_h::CmdLine::add_flag((string *)&metric_doc,local_1e0);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  local_1c0 = psVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"mesh.msh",&local_231);
  std::__cxx11::string::string((string *)&metric_in_flag);
  Omega_h::CmdLineFlag::add_arg<std::__cxx11::string>(psVar6,local_230);
  std::__cxx11::string::~string((string *)&metric_in_flag);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"--metric-in",&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"input metric file path",&local_2a9);
  psVar6 = (string *)Omega_h::CmdLine::add_flag((string *)&metric_doc,local_280);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  pCVar1 = mesh_in_flag;
  local_260 = psVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,(char *)pCVar1,&local_2d1);
  std::__cxx11::string::string((string *)&metric_out_flag);
  Omega_h::CmdLineFlag::add_arg<std::__cxx11::string>(psVar6,local_2d0);
  std::__cxx11::string::~string((string *)&metric_out_flag);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"--metric-out",&local_321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"output metric file path",&local_349);
  psVar6 = (string *)Omega_h::CmdLine::add_flag((string *)&metric_doc,local_320);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  pCVar1 = mesh_in_flag;
  local_300 = psVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,(char *)pCVar1,&local_371);
  std::__cxx11::string::string(local_398);
  Omega_h::CmdLineFlag::add_arg<std::__cxx11::string>(psVar6,local_370);
  std::__cxx11::string::~string(local_398);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_3a8,(shared_ptr<Omega_h::Comm> *)local_c0);
  bVar2 = Omega_h::CmdLine::parse_final
                    (&metric_doc,&local_3a8,&argv_local,
                     lib.timers._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_3a8);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3d0,"--mesh-in",&local_3d1);
    bVar2 = Omega_h::CmdLine::parsed((string *)&metric_doc);
    std::__cxx11::string::~string(local_3d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
    if (((bVar2 ^ 0xff) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f8,"--mesh-out",&local_3f9);
      bVar2 = Omega_h::CmdLine::parsed((string *)&metric_doc);
      std::__cxx11::string::~string(local_3f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
      if (((bVar2 ^ 0xff) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_420,"--metric-in",&local_421);
        bVar2 = Omega_h::CmdLine::parsed((string *)&metric_doc);
        std::__cxx11::string::~string(local_420);
        std::allocator<char>::~allocator((allocator<char> *)&local_421);
        if (((bVar2 ^ 0xff) & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_488,"--mesh-in",&local_489);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_4b0,"mesh.msh",&local_4b1);
          Omega_h::CmdLine::get<std::__cxx11::string>(local_468,(string *)&metric_doc);
          Omega_h::filesystem::path::path(local_448,local_468);
          std::__cxx11::string::~string(local_468);
          std::__cxx11::string::~string(local_4b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
          std::__cxx11::string::~string(local_488);
          std::allocator<char>::~allocator((allocator<char> *)&local_489);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_518,"--mesh-out",&local_519);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_540,"mesh.msh",&local_541);
          Omega_h::CmdLine::get<std::__cxx11::string>(local_4f8,(string *)&metric_doc);
          Omega_h::filesystem::path::path(local_4d8,local_4f8);
          std::__cxx11::string::~string(local_4f8);
          std::__cxx11::string::~string(local_540);
          std::allocator<char>::~allocator((allocator<char> *)&local_541);
          std::__cxx11::string::~string(local_518);
          std::allocator<char>::~allocator((allocator<char> *)&local_519);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_5a8,"--metric-in",&local_5a9);
          pCVar1 = mesh_in_flag;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_5d0,(char *)pCVar1,&local_5d1);
          Omega_h::CmdLine::get<std::__cxx11::string>(local_588,(string *)&metric_doc);
          Omega_h::filesystem::path::path(local_568,local_588);
          std::__cxx11::string::~string(local_588);
          std::__cxx11::string::~string(local_5d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
          std::__cxx11::string::~string(local_5a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
          poVar7 = std::operator<<((ostream *)&std::cout,"Loading mesh from ");
          poVar7 = (ostream *)Omega_h::filesystem::operator<<(poVar7,local_448);
          std::operator<<(poVar7,"\n");
          this = &target_metric.write_.shared_alloc_.direct_ptr;
          std::shared_ptr<Omega_h::Comm>::shared_ptr
                    ((shared_ptr<Omega_h::Comm> *)this,(shared_ptr<Omega_h::Comm> *)local_c0);
          Omega_h::gmsh::read(local_9b0,local_448,this);
          std::shared_ptr<Omega_h::Comm>::~shared_ptr
                    ((shared_ptr<Omega_h::Comm> *)&target_metric.write_.shared_alloc_.direct_ptr);
          _argc_local = auStack_9d0;
          _auStack_9d0 = (Alloc *)0x0;
          target_metric.write_.shared_alloc_.alloc = (Alloc *)0x0;
          local_18 = _argc_local;
          local_10 = _argc_local;
          poVar7 = std::operator<<((ostream *)&std::cout,"Loading target metric from ");
          poVar7 = (ostream *)Omega_h::filesystem::operator<<(poVar7,local_568);
          std::operator<<(poVar7,"\n");
          IVar4 = Omega_h::Mesh::dim(local_9b0);
          Omega_h::filesystem::path::extension();
          Omega_h::filesystem::path::string_abi_cxx11_();
          Omega_h::filesystem::path::~path(local_a18);
          bVar3 = std::operator==(local_9f8,".txt");
          if (bVar3) {
            iVar5 = Omega_h::Mesh::nverts();
            local_1c = IVar4;
            Omega_h::read_reals_txt((path *)&local_a28,(int)local_568,iVar5);
            Omega_h::Read<double>::operator=((Read<double> *)auStack_9d0,&local_a28);
            Omega_h::Read<double>::~Read(&local_a28);
            Omega_h::Read<double>::Read(&local_a48,(Read<double> *)auStack_9d0);
            Omega_h::symms_inria2osh(&local_a38,IVar4,&local_a48);
            Omega_h::Read<double>::operator=((Read<double> *)auStack_9d0,&local_a38);
            Omega_h::Read<double>::~Read(&local_a38);
            Omega_h::Read<double>::~Read(&local_a48);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_a68,"target_metric",&local_a69);
            local_20 = IVar4;
            Omega_h::Read<double>::Read(&local_a80,(Read<double> *)auStack_9d0);
            Omega_h::Mesh::add_tag<double>
                      (local_9b0,0,local_a68,((IVar4 + 1) * IVar4) / 2,&local_a80);
            Omega_h::Read<double>::~Read(&local_a80);
            std::__cxx11::string::~string(local_a68);
            std::allocator<char>::~allocator((allocator<char> *)&local_a69);
          }
          else {
            uVar8 = Omega_h::filesystem::path::c_str();
            Omega_h::fail("unknown extension for \"%s\"\n",uVar8);
          }
          Omega_h::AdaptOpts::AdaptOpts(local_bd0,local_9b0);
          Omega_h::Read<double>::Read(&local_be0,(Read<double> *)auStack_9d0);
          Omega_h::grade_fix_adapt(local_9b0,local_bd0,&local_be0,1);
          Omega_h::Read<double>::~Read(&local_be0);
          poVar7 = std::operator<<((ostream *)&std::cout,"Storing mesh in ");
          poVar7 = (ostream *)Omega_h::filesystem::operator<<(poVar7,local_4d8);
          std::operator<<(poVar7,'\n');
          Omega_h::gmsh::write(local_4d8,local_9b0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_c00,"--metric-out",&local_c01);
          bVar2 = Omega_h::CmdLine::parsed((string *)&metric_doc);
          std::__cxx11::string::~string(local_c00);
          std::allocator<char>::~allocator((allocator<char> *)&local_c01);
          if ((bVar2 & 1) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_c68,"--metric-out",&local_c69);
            pCVar1 = mesh_in_flag;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_c90,(char *)pCVar1,&local_c91);
            Omega_h::CmdLine::get<std::__cxx11::string>(local_c48,(string *)&metric_doc);
            Omega_h::filesystem::path::path(local_c28,local_c48);
            std::__cxx11::string::~string(local_c48);
            std::__cxx11::string::~string(local_c90);
            std::allocator<char>::~allocator((allocator<char> *)&local_c91);
            std::__cxx11::string::~string(local_c68);
            std::allocator<char>::~allocator((allocator<char> *)&local_c69);
            Omega_h::filesystem::path::extension();
            Omega_h::filesystem::path::string_abi_cxx11_();
            Omega_h::filesystem::path::~path((path *)&metric.write_.shared_alloc_.direct_ptr);
            poVar7 = std::operator<<((ostream *)&std::cout,"Storing metric in ");
            poVar7 = (ostream *)Omega_h::filesystem::operator<<(poVar7,local_c28);
            std::operator<<(poVar7,'\n');
            bVar3 = std::operator==(local_cb8,".txt");
            if (bVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_d08,"metric",&local_d09);
              Omega_h::Mesh::get_array<double>((int)local_ce8,(string *)local_9b0);
              std::__cxx11::string::~string(local_d08);
              std::allocator<char>::~allocator((allocator<char> *)&local_d09);
              Omega_h::Read<double>::Read(&local_d30,(Read<double> *)local_ce8);
              Omega_h::symms_osh2inria(&local_d20,IVar4,&local_d30);
              Omega_h::Read<double>::operator=((Read<double> *)local_ce8,&local_d20);
              Omega_h::Read<double>::~Read(&local_d20);
              Omega_h::Read<double>::~Read(&local_d30);
              Omega_h::Read<double>::Read(&local_d40,(Read<double> *)local_ce8);
              local_24 = IVar4;
              Omega_h::write_reals_txt(local_c28,&local_d40,((IVar4 + 1) * IVar4) / 2);
              Omega_h::Read<double>::~Read(&local_d40);
              Omega_h::Read<double>::~Read((Read<double> *)local_ce8);
            }
            else {
              uVar8 = Omega_h::filesystem::path::c_str();
              Omega_h::fail("unknown extension for \"%s\"\n",uVar8);
            }
            std::__cxx11::string::~string((string *)local_cb8);
            Omega_h::filesystem::path::~path(local_c28);
          }
          Omega_h::AdaptOpts::~AdaptOpts(local_bd0);
          std::__cxx11::string::~string((string *)local_9f8);
          Omega_h::Read<double>::~Read((Read<double> *)auStack_9d0);
          Omega_h::Mesh::~Mesh(local_9b0);
          Omega_h::filesystem::path::~path(local_568);
          Omega_h::filesystem::path::~path(local_4d8);
          Omega_h::filesystem::path::~path(local_448);
          local_3ac = 0;
        }
        else {
          std::operator<<((ostream *)&std::cout,"No input metric file specified\n");
          Omega_h::CmdLine::show_help(&metric_doc);
          argv_local._4_4_ = -1;
          local_3ac = 1;
        }
      }
      else {
        std::operator<<((ostream *)&std::cout,"No output mesh file specified\n");
        Omega_h::CmdLine::show_help(&metric_doc);
        argv_local._4_4_ = -1;
        local_3ac = 1;
      }
    }
    else {
      std::operator<<((ostream *)&std::cout,"No input mesh file specified\n");
      Omega_h::CmdLine::show_help(&metric_doc);
      argv_local._4_4_ = -1;
      local_3ac = 1;
    }
  }
  else {
    argv_local._4_4_ = -1;
    local_3ac = 1;
  }
  Omega_h::CmdLine::~CmdLine((CmdLine *)&metric_doc);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)local_c0);
  Omega_h::Library::~Library
            ((Library *)
             &comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
  auto lib = Omega_h::Library(&argc, &argv);
  auto comm = lib.world();
  Omega_h::CmdLine cmdline;
#ifdef OMEGA_H_USE_LIBMESHB
  auto metric_doc = "metric.{txt,sol}";
#else
  auto metric_doc = "metric.txt";
#endif
  auto& mesh_in_flag = cmdline.add_flag("--mesh-in", "input mesh file path");
  mesh_in_flag.add_arg<std::string>("mesh.msh");
  auto& mesh_out_flag = cmdline.add_flag("--mesh-out", "output mesh file path");
  mesh_out_flag.add_arg<std::string>("mesh.msh");
  auto& metric_in_flag =
      cmdline.add_flag("--metric-in", "input metric file path");
  metric_in_flag.add_arg<std::string>(metric_doc);
  auto& metric_out_flag =
      cmdline.add_flag("--metric-out", "output metric file path");
  metric_out_flag.add_arg<std::string>(metric_doc);
  if (!cmdline.parse_final(comm, &argc, argv)) {
    return -1;
  }
  if (!cmdline.parsed("--mesh-in")) {
    std::cout << "No input mesh file specified\n";
    cmdline.show_help(argv);
    return -1;
  }
  if (!cmdline.parsed("--mesh-out")) {
    std::cout << "No output mesh file specified\n";
    cmdline.show_help(argv);
    return -1;
  }
  if (!cmdline.parsed("--metric-in")) {
    std::cout << "No input metric file specified\n";
    cmdline.show_help(argv);
    return -1;
  }
  Omega_h::filesystem::path mesh_in =
      cmdline.get<std::string>("--mesh-in", "mesh.msh");
  Omega_h::filesystem::path mesh_out =
      cmdline.get<std::string>("--mesh-out", "mesh.msh");
  Omega_h::filesystem::path metric_in =
      cmdline.get<std::string>("--metric-in", metric_doc);
  std::cout << "Loading mesh from " << mesh_in << "\n";
  auto mesh = Omega_h::gmsh::read(mesh_in, comm);
  Omega_h::Reals target_metric;
  std::cout << "Loading target metric from " << metric_in << "\n";
  auto const dim = mesh.dim();
  auto const metric_in_ext = metric_in.extension().string();
  if (metric_in_ext == ".txt") {
    target_metric = Omega_h::read_reals_txt(
        metric_in, mesh.nverts(), Omega_h::symm_ncomps(dim));
    target_metric = Omega_h::symms_inria2osh(dim, target_metric);
    mesh.add_tag(0, "target_metric", Omega_h::symm_ncomps(dim), target_metric);
  } else
#ifdef OMEGA_H_USE_LIBMESHB
      if (metric_in_ext == ".sol" || metric_in_ext == ".solb") {
    Omega_h::meshb::read_sol(&mesh, metric_in.c_str(), "target_metric");
    target_metric = mesh.get_array<Omega_h::Real>(0, "target_metric");
  } else
#endif
  {
    Omega_h_fail("unknown extension for \"%s\"\n", metric_in.c_str());
  }
  auto opts = Omega_h::AdaptOpts(&mesh);
  Omega_h::grade_fix_adapt(&mesh, opts, target_metric, /*verbose=*/true);
  std::cout << "Storing mesh in " << mesh_out << '\n';
  Omega_h::gmsh::write(mesh_out, &mesh);
  if (cmdline.parsed("--metric-out")) {
    Omega_h::filesystem::path metric_out =
        cmdline.get<std::string>("--metric-out", metric_doc);
    auto const metric_out_ext = metric_out.extension().string();
    std::cout << "Storing metric in " << metric_out << '\n';
    if (metric_out_ext == ".txt") {
      auto metric = mesh.get_array<Omega_h::Real>(0, "metric");
      metric = Omega_h::symms_osh2inria(dim, metric);
      Omega_h::write_reals_txt(metric_out, metric, Omega_h::symm_ncomps(dim));
    } else
#ifdef OMEGA_H_USE_LIBMESHB
        if (metric_out_ext == ".sol" || metric_out_ext == ".solb") {
      Omega_h::meshb::write_sol(&mesh, metric_out.c_str(), "metric");
    } else
#endif
    {
      Omega_h_fail("unknown extension for \"%s\"\n", metric_out.c_str());
    }
  }
}